

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  int iVar1;
  void *__src;
  LogEst LVar2;
  void *pvVar3;
  undefined8 *puVar4;
  Expr *pEVar5;
  ushort in_DX;
  Expr *in_RSI;
  undefined8 *in_RDI;
  sqlite3 *db;
  WhereTerm *pOld;
  int idx;
  WhereTerm *pTerm;
  Expr *in_stack_ffffffffffffffb8;
  WhereInfo *pWInfo;
  
  if (*(int *)(in_RDI + 3) <= *(int *)((long)in_RDI + 0x14)) {
    __src = (void *)in_RDI[4];
    pWInfo = (WhereInfo *)**(undefined8 **)*in_RDI;
    pvVar3 = sqlite3WhereMalloc(pWInfo,(u64)in_stack_ffffffffffffffb8);
    in_RDI[4] = pvVar3;
    if (in_RDI[4] == 0) {
      if ((in_DX & 1) != 0) {
        sqlite3ExprDelete((sqlite3 *)pWInfo,in_stack_ffffffffffffffb8);
      }
      in_RDI[4] = __src;
      return 0;
    }
    memcpy((void *)in_RDI[4],__src,(long)*(int *)((long)in_RDI + 0x14) * 0x38);
    *(int *)(in_RDI + 3) = *(int *)(in_RDI + 3) << 1;
  }
  iVar1 = *(int *)((long)in_RDI + 0x14);
  *(int *)((long)in_RDI + 0x14) = iVar1 + 1;
  puVar4 = (undefined8 *)(in_RDI[4] + (long)iVar1 * 0x38);
  if ((in_DX & 2) == 0) {
    *(undefined4 *)((long)in_RDI + 0x1c) = *(undefined4 *)((long)in_RDI + 0x14);
  }
  if ((in_RSI == (Expr *)0x0) || ((in_RSI->flags & 0x80000) == 0)) {
    *(undefined2 *)(puVar4 + 2) = 1;
  }
  else {
    LVar2 = sqlite3LogEst((long)in_RSI->iTable);
    *(LogEst *)(puVar4 + 2) = LVar2 + -0x10e;
  }
  pEVar5 = sqlite3ExprSkipCollateAndLikely(in_RSI);
  *puVar4 = pEVar5;
  *(ushort *)((long)puVar4 + 0x12) = in_DX;
  puVar4[1] = in_RDI;
  *(undefined4 *)(puVar4 + 3) = 0xffffffff;
  memset((void *)((long)puVar4 + 0x14),0,0x24);
  return iVar1;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3WhereMalloc(pWC->pWInfo, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    pWC->nSlot = pWC->nSlot*2;
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( (wtFlags & TERM_VIRTUAL)==0 ) pWC->nBase = pWC->nTerm;
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollateAndLikely(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}